

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::SetShadingRate
          (DeviceContextVkImpl *this,SHADING_RATE BaseRate,SHADING_RATE_COMBINER PrimitiveCombiner,
          SHADING_RATE_COMBINER TextureCombiner)

{
  RenderDeviceVkImpl *this_00;
  VulkanLogicalDevice *this_01;
  Char *pCVar1;
  undefined1 local_c0 [8];
  string msg_3;
  string msg_2;
  string msg_1;
  undefined1 local_50 [8];
  string msg;
  VkFragmentShadingRateCombinerOpKHR local_28;
  VkFragmentShadingRateCombinerOpKHR local_24;
  VkFragmentShadingRateCombinerOpKHR CombinerOps [2];
  ExtensionFeatures *ExtFeatures;
  SHADING_RATE_COMBINER TextureCombiner_local;
  SHADING_RATE_COMBINER PrimitiveCombiner_local;
  SHADING_RATE BaseRate_local;
  DeviceContextVkImpl *this_local;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::SetShadingRate
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,BaseRate,PrimitiveCombiner,
             TextureCombiner,0);
  this_00 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->
                      (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                        super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice);
  this_01 = RenderDeviceVkImpl::GetLogicalDevice(this_00);
  CombinerOps = (VkFragmentShadingRateCombinerOpKHR  [2])
                VulkanUtilities::VulkanLogicalDevice::GetEnabledExtFeatures(this_01);
  if (*(VkBool32 *)((long)CombinerOps + 0x218) == 0) {
    if (*(VkBool32 *)((long)CombinerOps + 0x230) == 0) {
      FormatString<char[50]>((string *)local_c0,(char (*) [50])0xf54e32);
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"SetShadingRate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xfc0);
      std::__cxx11::string::~string((string *)local_c0);
    }
    else {
      if (BaseRate != SHADING_RATE_1X1) {
        FormatString<char[66]>
                  ((string *)local_50,
                   (char (*) [66])
                   "IDeviceContext::SetShadingRate: BaseRate must be SHADING_RATE_1X1");
        pCVar1 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar1,"SetShadingRate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0xfbb);
        std::__cxx11::string::~string((string *)local_50);
      }
      if (PrimitiveCombiner != SHADING_RATE_COMBINER_PASSTHROUGH) {
        FormatString<char[92]>
                  ((string *)((long)&msg_2.field_2 + 8),
                   (char (*) [92])
                   "IDeviceContext::SetShadingRate: PrimitiveCombiner must be SHADING_RATE_COMBINER_PASSTHROUGH"
                  );
        pCVar1 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar1,"SetShadingRate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0xfbc);
        std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
      }
      if (TextureCombiner != SHADING_RATE_COMBINER_OVERRIDE) {
        FormatString<char[87]>
                  ((string *)((long)&msg_3.field_2 + 8),
                   (char (*) [87])
                   "IDeviceContext::SetShadingRate: TextureCombiner must be SHADING_RATE_COMBINER_OVERRIDE"
                  );
        pCVar1 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar1,"SetShadingRate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0xfbd);
        std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
      }
    }
  }
  else {
    local_28 = ShadingRateCombinerToVkFragmentShadingRateCombinerOp(PrimitiveCombiner);
    local_24 = ShadingRateCombinerToVkFragmentShadingRateCombinerOp(TextureCombiner);
    EnsureVkCmdBuffer(this);
    msg.field_2._8_8_ = ShadingRateToVkFragmentSize(BaseRate);
    VulkanUtilities::VulkanCommandBuffer::SetFragmentShadingRate
              (&this->m_CommandBuffer,(VkExtent2D *)((long)&msg.field_2 + 8),&local_28);
    (this->m_State).ShadingRateIsSet = true;
  }
  return;
}

Assistant:

void DeviceContextVkImpl::SetShadingRate(SHADING_RATE BaseRate, SHADING_RATE_COMBINER PrimitiveCombiner, SHADING_RATE_COMBINER TextureCombiner)
{
    TDeviceContextBase::SetShadingRate(BaseRate, PrimitiveCombiner, TextureCombiner, 0);

    const auto& ExtFeatures = m_pDevice->GetLogicalDevice().GetEnabledExtFeatures();
    if (ExtFeatures.ShadingRate.attachmentFragmentShadingRate != VK_FALSE)
    {
        const VkFragmentShadingRateCombinerOpKHR CombinerOps[2] =
            {
                ShadingRateCombinerToVkFragmentShadingRateCombinerOp(PrimitiveCombiner),
                ShadingRateCombinerToVkFragmentShadingRateCombinerOp(TextureCombiner) //
            };

        EnsureVkCmdBuffer();
        m_CommandBuffer.SetFragmentShadingRate(ShadingRateToVkFragmentSize(BaseRate), CombinerOps);
        m_State.ShadingRateIsSet = true;
    }
    else if (ExtFeatures.FragmentDensityMap.fragmentDensityMap != VK_FALSE)
    {
        // Ignored
        DEV_CHECK_ERR(BaseRate == SHADING_RATE_1X1, "IDeviceContext::SetShadingRate: BaseRate must be SHADING_RATE_1X1");
        DEV_CHECK_ERR(PrimitiveCombiner == SHADING_RATE_COMBINER_PASSTHROUGH, "IDeviceContext::SetShadingRate: PrimitiveCombiner must be SHADING_RATE_COMBINER_PASSTHROUGH");
        DEV_CHECK_ERR(TextureCombiner == SHADING_RATE_COMBINER_OVERRIDE, "IDeviceContext::SetShadingRate: TextureCombiner must be SHADING_RATE_COMBINER_OVERRIDE");
    }
    else
        UNEXPECTED("VariableRateShading device feature is not enabled");
}